

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O1

int __thiscall Fl_Image::fail(Fl_Image *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = -(uint)(this->ld_ == 0) | this->ld_;
  uVar1 = 0;
  if (this->d_ < 1) {
    uVar1 = uVar2;
  }
  if (this->h_ < 1) {
    uVar1 = uVar2;
  }
  if (this->w_ < 1) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

int Fl_Image::fail()
{
    // if no image exists, ld_ may contain a simple error code
    if ( (w_<=0) || (h_<=0) || (d_<=0) ) {
        if (ld_==0)
            return ERR_NO_IMAGE;
        else
            return ld_;
    }
    return 0;
}